

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::WriteComment(ostream *os,string *comment)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  string replace;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (comment->_M_string_length != 0) {
    local_50[0] = local_40;
    pcVar1 = (comment->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + comment->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"\n#############################################\n",0x2f);
    lVar2 = std::__cxx11::string::find((char)local_50,10);
    if (lVar2 != -1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        lVar2 = std::__cxx11::string::find((char)local_50,10);
      } while (lVar2 != -1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteAssumedSourceDependencies()
{
  for (std::map<std::string, std::set<std::string> >::iterator
       i = this->AssumedSourceDependencies.begin();
       i != this->AssumedSourceDependencies.end(); ++i) {
    cmNinjaDeps deps;
    std::copy(i->second.begin(), i->second.end(), std::back_inserter(deps));
    WriteCustomCommandBuild(/*command=*/"", /*description=*/"",
                            "Assume dependencies for generated source file.",
                            /*uses_terminal*/false,
                            /*restat*/true,
                            cmNinjaDeps(1, i->first), deps);
  }
}